

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::addBend(Molecule *this,Bend *bend)

{
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  _Var1;
  Bend *local_10;
  
  local_10 = bend;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Bend**,std::vector<OpenMD::Bend*,std::allocator<OpenMD::Bend*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Bend*const>>
                    ((this->bends_).
                     super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->bends_).
                     super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::push_back(&this->bends_,&local_10)
    ;
  }
  return;
}

Assistant:

void Molecule::addBend(Bend* bend) {
    if (std::find(bends_.begin(), bends_.end(), bend) == bends_.end()) {
      bends_.push_back(bend);
    }
  }